

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_input.cpp
# Opt level: O0

bool __thiscall Omega_h::InputScalar::as(InputScalar *this,double *out)

{
  byte bVar1;
  void *this_00;
  byte local_1ba;
  istringstream local_198 [8];
  istringstream ss;
  double *out_local;
  InputScalar *this_local;
  
  std::__cxx11::istringstream::istringstream(local_198,(string *)&this->str,_S_in);
  this_00 = (void *)std::istream::operator>>(local_198,std::noskipws);
  std::istream::operator>>(this_00,out);
  bVar1 = std::ios::eof();
  local_1ba = 0;
  if ((bVar1 & 1) != 0) {
    local_1ba = std::ios::fail();
    local_1ba = local_1ba ^ 0xff;
  }
  std::__cxx11::istringstream::~istringstream(local_198);
  return (bool)(local_1ba & 1);
}

Assistant:

bool InputScalar::as(double& out) const {
  std::istringstream ss(str);
  ss >> std::noskipws >> out;
  return ss.eof() && !ss.fail();
}